

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

int is_swizzle_str(char *str,int veclen)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  
  if (*str == '\0') {
    __assert_fail("*str != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x8c6,"int is_swizzle_str(const char *, const int)");
  }
  if (veclen < 1) {
    return 0;
  }
  lVar3 = 0;
  iVar2 = 0;
  iVar1 = 0;
  do {
    uVar4 = (byte)str[lVar3] - 0x61;
    if (uVar4 < 0x1a) {
      if ((0x20043U >> (uVar4 & 0x1f) & 1) == 0) {
        if ((0x3c00000U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_00143fb3;
        iVar1 = 1;
      }
      else {
        iVar2 = 1;
      }
    }
    else {
LAB_00143fb3:
      if (str[lVar3] == 0) {
        bVar5 = true;
        goto LAB_00143fc3;
      }
    }
    lVar3 = lVar3 + 1;
  } while (veclen != (int)lVar3);
  bVar5 = str[(uint)veclen] == '\0';
LAB_00143fc3:
  return (int)(byte)(iVar1 + iVar2 == 1 & bVar5);
}

Assistant:

static int is_swizzle_str(const char *str, const int veclen)
{
    int i;
    int is_xyzw = 0;
    int is_rgba = 0;

    assert(*str != '\0');  // can this actually happen?

    for (i = 0; i < veclen; i++, str++)
    {
        const char ch = *str;
        if (ch == '\0')
            break;
        else if ((ch == 'x') || (ch == 'y') || (ch == 'z') || (ch == 'w'))
            is_xyzw = 1;
        else if ((ch == 'r') || (ch == 'g') || (ch == 'b') || (ch == 'a'))
            is_rgba = 1;
    } // for

    if (*str != '\0')  // must be end of string here.
        return 0;  // not a swizzle.
    return ((is_rgba + is_xyzw) == 1);  // can only be one or the other.
}